

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.cpp
# Opt level: O0

void Diligent::ValidateFramebufferDesc(FramebufferDesc *Desc,IRenderDevice *pDevice)

{
  MISC_TEXTURE_FLAGS MVar1;
  SHADING_RATE_CAP_FLAGS SVar2;
  int iVar3;
  BIND_FLAGS BVar4;
  undefined4 extraout_var;
  TEXTURE_FORMAT *pTVar5;
  long lVar6;
  Char *pCVar7;
  long *plVar8;
  TextureFormatAttribs *pTVar9;
  TextureFormatAttribs *Args_8;
  uint *puVar10;
  undefined4 extraout_var_00;
  char (*Args_1) [47];
  char (*Args_1_00) [37];
  char *in_stack_fffffffffffffb18;
  _func_int **local_498;
  ShadingRateProperties *local_470;
  _func_int **local_460;
  TextureViewDesc *local_458;
  _func_int **local_430;
  TextureDesc *local_428;
  TextureViewDesc *local_420;
  AttachmentReference *local_3f8;
  TextureDesc *local_3f0;
  TextureViewDesc *local_3e8;
  _func_int **local_3c0;
  TextureDesc *local_3b8;
  TextureViewDesc *local_3b0;
  _func_int **local_388;
  TextureDesc *local_380;
  _func_int **local_370;
  _func_int **local_368;
  _func_int **local_360;
  _func_int **local_358;
  _func_int **local_348;
  RenderPassDesc *local_340;
  _func_int **local_338;
  char *local_330;
  _func_int **local_328;
  long local_320;
  TextureDesc *TexDesc_6;
  undefined1 local_310 [4];
  Uint32 i_4;
  string msg_7;
  ShadingRateProperties *SRProps;
  char **local_2e0;
  TextureDesc *TexDesc_5;
  string msg_6;
  TextureViewDesc *ViewDesc_4;
  char *local_2a0;
  ITextureView **pAttachment_3;
  string msg_5;
  ShadingRateAttachment *AttchRef_4;
  SubpassDesc *Subpass_1;
  Uint32 i_3;
  bool IsVRSEnabled;
  char **local_258;
  TextureDesc *TexDesc_4;
  long local_248;
  TextureViewDesc *ViewDesc_3;
  _func_int **local_238;
  ITextureView **pAttachment_2;
  string msg_4;
  AttachmentReference *AttchRef_3;
  char **local_200;
  TextureDesc *TexDesc_3;
  long local_1f0;
  TextureViewDesc *ViewDesc_2;
  _func_int **local_1e0;
  ITextureView **pAttachment_1;
  string msg_3;
  AttachmentReference *AttchRef_2;
  _func_int **pp_Stack_1a8;
  Uint32 rslv_attachment;
  char **local_1a0;
  TextureDesc *TexDesc_2;
  long local_190;
  TextureViewDesc *ViewDesc_1;
  _func_int **local_180;
  ITextureView **pAttachment;
  string msg_2;
  AttachmentReference *AttchRef_1;
  _func_int **pp_Stack_148;
  Uint32 rt_attachment;
  char **local_140;
  TextureDesc *TexDesc_1;
  undefined1 local_130 [8];
  string msg_1;
  AttachmentReference *AttchRef;
  Uint32 input_attachment;
  SubpassDesc *Subpass;
  _func_int **pp_Stack_f0;
  Uint32 i_2;
  _func_int **local_e8;
  byte local_d9;
  uint local_d8;
  uint uStack_d4;
  bool HasStencilComponent;
  _func_int **local_d0;
  _func_int **local_c8;
  long local_c0;
  TextureDesc *TexDesc;
  undefined1 local_a8 [8];
  string msg;
  TextureViewDesc *ViewDesc;
  RenderPassAttachmentDesc *AttDesc;
  Uint32 i_1;
  bool IsMetal;
  char **local_68;
  RenderPassDesc *RPDesc;
  uint local_54;
  _func_int **pp_Stack_50;
  Uint32 i;
  char *local_48;
  IRenderDevice *local_40;
  IRenderDevice *pDevice_local;
  FramebufferDesc *Desc_local;
  
  local_40 = pDevice;
  pDevice_local = (IRenderDevice *)Desc;
  if (Desc->pRenderPass == (IRenderPass *)0x0) {
    if ((Desc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_330 = "";
    }
    else {
      local_330 = (Desc->super_DeviceObjectAttribs).Name;
    }
    local_48 = local_330;
    in_stack_fffffffffffffb18 = "\' is invalid: ";
    LogError<true,char[29],char_const*,char[15],char[30]>
              (false,"ValidateFramebufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
               ,0x28,(char (*) [29])"Description of framebuffer \'",&local_48,
               (char (*) [15])"\' is invalid: ",(char (*) [30])"render pass must not be null.");
  }
  if ((*(int *)&pDevice_local[2].super_IObject._vptr_IObject != 0) &&
     (pDevice_local[3].super_IObject._vptr_IObject == (_func_int **)0x0)) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_338 = (_func_int **)0xe30c4c;
    }
    else {
      local_338 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    pp_Stack_50 = local_338;
    in_stack_fffffffffffffb18 = "\' is invalid: ";
    LogError<true,char[29],char_const*,char[15],char[57]>
              (false,"ValidateFramebufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
               ,0x30,(char (*) [29])"Description of framebuffer \'",
               (char **)&stack0xffffffffffffffb0,(char (*) [15])"\' is invalid: ",
               (char (*) [57])"attachment count is not zero, but ppAttachments is null.");
  }
  for (local_54 = 0; local_54 < *(uint *)&pDevice_local[2].super_IObject._vptr_IObject;
      local_54 = local_54 + 1) {
    if (pDevice_local[3].super_IObject._vptr_IObject[local_54] == (_func_int *)0x0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_340 = (RenderPassDesc *)0xe30c4c;
      }
      else {
        local_340 = (RenderPassDesc *)(pDevice_local->super_IObject)._vptr_IObject;
      }
      RPDesc = local_340;
      in_stack_fffffffffffffb18 = "\' is invalid: ";
      LogError<true,char[29],char_const*,char[15],char[24],unsigned_int,char[10]>
                (false,"ValidateFramebufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                 ,0x3a,(char (*) [29])"Description of framebuffer \'",(char **)&RPDesc,
                 (char (*) [15])"\' is invalid: ",(char (*) [24])"framebuffer attachment ",&local_54
                 ,(char (*) [10])0xf4d16d);
    }
  }
  local_68 = (char **)(**(code **)(*pDevice_local[1].super_IObject._vptr_IObject + 0x20))();
  if (*(int *)&pDevice_local[2].super_IObject._vptr_IObject != *(int *)(local_68 + 1)) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_348 = (_func_int **)0xe30c4c;
    }
    else {
      local_348 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    _i_1 = local_348;
    in_stack_fffffffffffffb18 = "\' is invalid: ";
    LogError<true,char[29],char_const*,char[15],char[40],unsigned_int,char[47],unsigned_int,char[23],char_const*,char[3]>
              (false,"ValidateFramebufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
               ,0x45,(char (*) [29])"Description of framebuffer \'",(char **)&i_1,
               (char (*) [15])"\' is invalid: ",
               (char (*) [40])"the number of framebuffer attachments (",(uint *)(pDevice_local + 2),
               (char (*) [47])") must be equal to the number of attachments (",
               (uint *)(local_68 + 1),(char (*) [23])") in the render pass \'",local_68,
               (char (*) [3])"\'.");
  }
  iVar3 = (*(local_40->super_IObject)._vptr_IObject[0x18])();
  AttDesc._7_1_ = RenderDeviceInfo::IsMetalDevice((RenderDeviceInfo *)CONCAT44(extraout_var,iVar3));
  for (AttDesc._0_4_ = 0; (uint)AttDesc < *(uint *)(local_68 + 1); AttDesc._0_4_ = (uint)AttDesc + 1
      ) {
    if (pDevice_local[3].super_IObject._vptr_IObject[(uint)AttDesc] != (_func_int *)0x0) {
      pTVar5 = (TEXTURE_FORMAT *)(local_68[2] + (ulong)(uint)AttDesc * 0x10);
      msg.field_2._8_8_ =
           (**(code **)(*(long *)pDevice_local[3].super_IObject._vptr_IObject[(uint)AttDesc] + 0x20)
           )();
      if (((AttDesc._7_1_ & 1) == 0) || (*(char *)(msg.field_2._8_8_ + 8) != '\x06')) {
        plVar8 = (long *)(**(code **)(*(long *)pDevice_local[3].super_IObject._vptr_IObject
                                               [(uint)AttDesc] + 0x50))();
        local_c0 = (**(code **)(*plVar8 + 0x20))();
        if (*(TEXTURE_FORMAT *)(msg.field_2._8_8_ + 10) != *pTVar5) {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_358 = (_func_int **)0xe30c4c;
          }
          else {
            local_358 = (pDevice_local->super_IObject)._vptr_IObject;
          }
          local_c8 = local_358;
          pTVar9 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(msg.field_2._8_8_ + 10));
          Args_8 = GetTextureFormatAttribs(*pTVar5);
          in_stack_fffffffffffffb18 = "\' is invalid: ";
          LogError<true,char[29],char_const*,char[15],char[13],char_const*,char[17],unsigned_int,char[29],char_const*,char[54]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,99,(char (*) [29])"Description of framebuffer \'",(char **)&local_c8,
                     (char (*) [15])"\' is invalid: ",(char (*) [13])0xf50356,&pTVar9->Name,
                     (char (*) [17])") of attachment ",(uint *)&AttDesc,
                     (char (*) [29])" does not match the format (",&Args_8->Name,
                     (char (*) [54])") defined by the render pass for the same attachment.");
        }
        if (*(uint *)(local_c0 + 0x20) != (uint)(byte)(char)pTVar5[1]) {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_360 = (_func_int **)0xe30c4c;
          }
          else {
            local_360 = (pDevice_local->super_IObject)._vptr_IObject;
          }
          local_d0 = local_360;
          uStack_d4 = *(uint *)(local_c0 + 0x20);
          local_d8 = (uint)(byte)(char)pTVar5[1];
          in_stack_fffffffffffffb18 = "\' is invalid: ";
          LogError<true,char[29],char_const*,char[15],char[19],unsigned_int,char[17],unsigned_int,char[35],unsigned_int,char[54]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0x6e,(char (*) [29])"Description of framebuffer \'",(char **)&local_d0,
                     (char (*) [15])"\' is invalid: ",(char (*) [19])0xf503a9,
                     &stack0xffffffffffffff2c,(char (*) [17])") of attachment ",(uint *)&AttDesc,
                     (char (*) [35])" does not match the sample count (",&local_d8,
                     (char (*) [54])") defined by the render pass for the same attachment.");
        }
        MVar1 = operator&(*(MISC_TEXTURE_FLAGS *)(local_c0 + 0x2a),MISC_TEXTURE_FLAG_MEMORYLESS);
        if (MVar1 != MISC_TEXTURE_FLAG_NONE) {
          pTVar9 = GetTextureFormatAttribs(*pTVar5);
          local_d9 = pTVar9->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
          if ((*(byte *)((long)pTVar5 + 3) == 0) ||
             (((bool)local_d9 && (*(byte *)((long)pTVar5 + 5) == 0)))) {
            if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
              local_368 = (_func_int **)0xe30c4c;
            }
            else {
              local_368 = (pDevice_local->super_IObject)._vptr_IObject;
            }
            local_e8 = local_368;
            in_stack_fffffffffffffb18 = "\' is invalid: ";
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[48]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x78,(char (*) [29])"Description of framebuffer \'",(char **)&local_e8,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"memoryless attachment ",
                       (uint *)&AttDesc,
                       (char (*) [48])" is not compatible with ATTACHMENT_LOAD_OP_LOAD");
          }
          if (((char)pTVar5[2] == TEX_FORMAT_UNKNOWN) ||
             (((local_d9 & 1) != 0 && ((char)pTVar5[3] == TEX_FORMAT_UNKNOWN)))) {
            if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
              local_370 = (_func_int **)0xe30c4c;
            }
            else {
              local_370 = (pDevice_local->super_IObject)._vptr_IObject;
            }
            pp_Stack_f0 = local_370;
            in_stack_fffffffffffffb18 = "\' is invalid: ";
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[50]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x7d,(char (*) [29])"Description of framebuffer \'",
                       (char **)&stack0xffffffffffffff10,(char (*) [15])"\' is invalid: ",
                       (char (*) [23])"memoryless attachment ",(uint *)&AttDesc,
                       (char (*) [50])" is not compatible with ATTACHMENT_STORE_OP_STORE");
          }
        }
      }
      else {
        Args_1 = (char (*) [47])(ulong)(uint)AttDesc;
        lVar6 = (**(code **)(*(long *)pDevice_local[3].super_IObject._vptr_IObject[(long)Args_1] +
                            0x50))();
        if (lVar6 != 0) {
          FormatString<char[26],char[47]>
                    ((string *)local_a8,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"Desc.ppAttachments[i]->GetTexture() == nullptr",Args_1);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0x55);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
    }
  }
  for (Subpass._4_4_ = 0; Subpass._4_4_ < *(uint *)(local_68 + 3); Subpass._4_4_ = Subpass._4_4_ + 1
      ) {
    puVar10 = (uint *)(local_68[4] + (ulong)Subpass._4_4_ * 0x48);
    for (AttchRef._4_4_ = 0; AttchRef._4_4_ < *puVar10; AttchRef._4_4_ = AttchRef._4_4_ + 1) {
      msg_1.field_2._8_8_ = *(long *)(puVar10 + 2) + (ulong)AttchRef._4_4_ * 8;
      if (*(int *)*(char (*) [25])msg_1.field_2._8_8_ != -1) {
        if (*(uint *)&pDevice_local[2].super_IObject._vptr_IObject <=
            *(uint *)*(char (*) [25])msg_1.field_2._8_8_) {
          FormatString<char[25],unsigned_int,char[43],unsigned_int,char[48]>
                    ((string *)local_130,(Diligent *)"Input attachment index (",
                     (char (*) [25])msg_1.field_2._8_8_,
                     (uint *)") must be less than the attachment count (",
                     (char (*) [43])(pDevice_local + 2),
                     (uint *)") as this is ensured by ValidateRenderPassDesc.",
                     (char (*) [48])in_stack_fffffffffffffb18);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0xb1);
          std::__cxx11::string::~string((string *)local_130);
        }
        if (pDevice_local[3].super_IObject._vptr_IObject[*(uint *)msg_1.field_2._8_8_] ==
            (_func_int *)0x0) {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_380 = (TextureDesc *)0xe30c4c;
          }
          else {
            local_380 = (TextureDesc *)(pDevice_local->super_IObject)._vptr_IObject;
          }
          TexDesc_1 = local_380;
          in_stack_fffffffffffffb18 = "\' is invalid: ";
          LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[41],unsigned_int,char[18],char_const*,char[25]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0xb8,(char (*) [29])"Description of framebuffer \'",(char **)&TexDesc_1,
                     (char (*) [15])"\' is invalid: ",(char (*) [21])0xf54d26,
                     (uint *)msg_1.field_2._8_8_,
                     (char (*) [41])" is used as input attachment by subpass ",
                     (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                     (char (*) [25])"\', and must not be null.");
        }
        plVar8 = (long *)(**(code **)(*(long *)pDevice_local[3].super_IObject._vptr_IObject
                                               [*(uint *)msg_1.field_2._8_8_] + 0x50))();
        local_140 = (char **)(**(code **)(*plVar8 + 0x20))();
        BVar4 = operator&(*(BIND_FLAGS *)((long)local_140 + 0x24),BIND_INPUT_ATTACHMENT);
        if (BVar4 == BIND_NONE) {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_388 = (_func_int **)0xe30c4c;
          }
          else {
            local_388 = (pDevice_local->super_IObject)._vptr_IObject;
          }
          pp_Stack_148 = local_388;
          in_stack_fffffffffffffb18 = "\' is invalid: ";
          LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[41],unsigned_int,char[18],char_const*,char[61]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0xc6,(char (*) [29])"Description of framebuffer \'",
                     (char **)&stack0xfffffffffffffeb8,(char (*) [15])"\' is invalid: ",
                     (char (*) [17])"the attachment \'",local_140,(char (*) [12])"\' at index ",
                     (uint *)msg_1.field_2._8_8_,
                     (char (*) [41])" is used as input attachment by subpass ",
                     (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                     (char (*) [61])"\', but was not created with BIND_INPUT_ATTACHMENT bind flag.")
          ;
        }
      }
    }
    for (AttchRef_1._4_4_ = 0; AttchRef_1._4_4_ < puVar10[4];
        AttchRef_1._4_4_ = AttchRef_1._4_4_ + 1) {
      msg_2.field_2._8_8_ = *(long *)(puVar10 + 6) + (ulong)AttchRef_1._4_4_ * 8;
      if (*(int *)*(char (*) [33])msg_2.field_2._8_8_ != -1) {
        if (*(uint *)&pDevice_local[2].super_IObject._vptr_IObject <=
            *(uint *)*(char (*) [33])msg_2.field_2._8_8_) {
          FormatString<char[33],unsigned_int,char[43],unsigned_int,char[48]>
                    ((string *)&pAttachment,(Diligent *)"Render target attachment index (",
                     (char (*) [33])msg_2.field_2._8_8_,
                     (uint *)") must be less than the attachment count (",
                     (char (*) [43])(pDevice_local + 2),
                     (uint *)") as this is ensured by ValidateRenderPassDesc.",
                     (char (*) [48])in_stack_fffffffffffffb18);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0xd2);
          std::__cxx11::string::~string((string *)&pAttachment);
        }
        local_180 = pDevice_local[3].super_IObject._vptr_IObject + *(uint *)msg_2.field_2._8_8_;
        if (*local_180 == (_func_int *)0x0) {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_3b0 = (TextureViewDesc *)0xe30c4c;
          }
          else {
            local_3b0 = (TextureViewDesc *)(pDevice_local->super_IObject)._vptr_IObject;
          }
          ViewDesc_1 = local_3b0;
          in_stack_fffffffffffffb18 = "\' is invalid: ";
          LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[25]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0xda,(char (*) [29])"Description of framebuffer \'",(char **)&ViewDesc_1,
                     (char (*) [15])"\' is invalid: ",(char (*) [21])0xf54d26,
                     (uint *)msg_2.field_2._8_8_,
                     (char (*) [49])" is used as render target attachment by subpass ",
                     (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                     (char (*) [25])"\', and must not be null.");
        }
        local_190 = (**(code **)(*(long *)*local_180 + 0x20))();
        if (*(char *)(local_190 + 8) != '\x02') {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_3b8 = (TextureDesc *)0xe30c4c;
          }
          else {
            local_3b8 = (TextureDesc *)(pDevice_local->super_IObject)._vptr_IObject;
          }
          TexDesc_2 = local_3b8;
          in_stack_fffffffffffffb18 = "\' is invalid: ";
          LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[44]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0xe3,(char (*) [29])"Description of framebuffer \'",(char **)&TexDesc_2,
                     (char (*) [15])"\' is invalid: ",(char (*) [21])0xf54d26,
                     (uint *)msg_2.field_2._8_8_,
                     (char (*) [49])" is used as render target attachment by subpass ",
                     (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                     (char (*) [44])"\', but is not a TEXTURE_VIEW_RENDER_TARGET.");
        }
        plVar8 = (long *)(**(code **)(*(long *)*local_180 + 0x50))();
        local_1a0 = (char **)(**(code **)(*plVar8 + 0x20))();
        BVar4 = operator&(*(BIND_FLAGS *)((long)local_1a0 + 0x24),BIND_RENDER_TARGET);
        if (BVar4 == BIND_NONE) {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_3c0 = (_func_int **)0xe30c4c;
          }
          else {
            local_3c0 = (pDevice_local->super_IObject)._vptr_IObject;
          }
          pp_Stack_1a8 = local_3c0;
          in_stack_fffffffffffffb18 = "\' is invalid: ";
          LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[58]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0xf1,(char (*) [29])"Description of framebuffer \'",
                     (char **)&stack0xfffffffffffffe58,(char (*) [15])"\' is invalid: ",
                     (char (*) [17])"the attachment \'",local_1a0,(char (*) [12])"\' at index ",
                     (uint *)msg_2.field_2._8_8_,
                     (char (*) [49])" is used as render target attachment by subpass ",
                     (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                     (char (*) [58])"\', but was not created with BIND_RENDER_TARGET bind flag.");
        }
      }
    }
    if (*(long *)(puVar10 + 8) != 0) {
      for (AttchRef_2._4_4_ = 0; AttchRef_2._4_4_ < puVar10[4];
          AttchRef_2._4_4_ = AttchRef_2._4_4_ + 1) {
        msg_3.field_2._8_8_ = *(long *)(puVar10 + 8) + (ulong)AttchRef_2._4_4_ * 8;
        if (*(int *)*(char (*) [27])msg_3.field_2._8_8_ != -1) {
          if (*(uint *)&pDevice_local[2].super_IObject._vptr_IObject <=
              *(uint *)*(char (*) [27])msg_3.field_2._8_8_) {
            FormatString<char[27],unsigned_int,char[43],unsigned_int,char[48]>
                      ((string *)&pAttachment_1,(Diligent *)"Resolve attachment index (",
                       (char (*) [27])msg_3.field_2._8_8_,
                       (uint *)") must be less than the attachment count (",
                       (char (*) [43])(pDevice_local + 2),
                       (uint *)") as this is ensured by ValidateRenderPassDesc.",
                       (char (*) [48])in_stack_fffffffffffffb18);
            pCVar7 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar7,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0xff);
            std::__cxx11::string::~string((string *)&pAttachment_1);
          }
          local_1e0 = pDevice_local[3].super_IObject._vptr_IObject + *(uint *)msg_3.field_2._8_8_;
          if (*local_1e0 == (_func_int *)0x0) {
            if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
              local_3e8 = (TextureViewDesc *)0xe30c4c;
            }
            else {
              local_3e8 = (TextureViewDesc *)(pDevice_local->super_IObject)._vptr_IObject;
            }
            ViewDesc_2 = local_3e8;
            in_stack_fffffffffffffb18 = "\' is invalid: ";
            LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[25]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x107,(char (*) [29])"Description of framebuffer \'",(char **)&ViewDesc_2,
                       (char (*) [15])"\' is invalid: ",(char (*) [21])0xf54d26,
                       (uint *)msg_3.field_2._8_8_,
                       (char (*) [43])" is used as resolve attachment by subpass ",
                       (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                       (char (*) [25])"\', and must not be null.");
          }
          local_1f0 = (**(code **)(*(long *)*local_1e0 + 0x20))();
          if (*(char *)(local_1f0 + 8) != '\x02') {
            if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
              local_3f0 = (TextureDesc *)0xe30c4c;
            }
            else {
              local_3f0 = (TextureDesc *)(pDevice_local->super_IObject)._vptr_IObject;
            }
            TexDesc_3 = local_3f0;
            in_stack_fffffffffffffb18 = "\' is invalid: ";
            LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[44]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x110,(char (*) [29])"Description of framebuffer \'",(char **)&TexDesc_3,
                       (char (*) [15])"\' is invalid: ",(char (*) [21])0xf54d26,
                       (uint *)msg_3.field_2._8_8_,
                       (char (*) [43])" is used as resolve attachment by subpass ",
                       (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                       (char (*) [44])"\', but is not a TEXTURE_VIEW_RENDER_TARGET.");
          }
          plVar8 = (long *)(**(code **)(*(long *)*local_1e0 + 0x50))();
          local_200 = (char **)(**(code **)(*plVar8 + 0x20))();
          BVar4 = operator&(*(BIND_FLAGS *)((long)local_200 + 0x24),BIND_RENDER_TARGET);
          if (BVar4 == BIND_NONE) {
            if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
              local_3f8 = (AttachmentReference *)0xe30c4c;
            }
            else {
              local_3f8 = (AttachmentReference *)(pDevice_local->super_IObject)._vptr_IObject;
            }
            AttchRef_3 = local_3f8;
            in_stack_fffffffffffffb18 = "\' is invalid: ";
            LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[58]>
                      (false,"ValidateFramebufferDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                       ,0x11e,(char (*) [29])"Description of framebuffer \'",(char **)&AttchRef_3,
                       (char (*) [15])"\' is invalid: ",(char (*) [17])"the attachment \'",local_200
                       ,(char (*) [12])"\' at index ",(uint *)msg_3.field_2._8_8_,
                       (char (*) [43])" is used as resolve attachment by subpass ",
                       (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                       (char (*) [58])"\', but was not created with BIND_RENDER_TARGET bind flag.");
          }
        }
      }
    }
    if ((*(long *)(puVar10 + 10) != 0) &&
       (msg_4.field_2._8_8_ = *(undefined8 *)(puVar10 + 10),
       *(int *)*(char (*) [33])msg_4.field_2._8_8_ != -1)) {
      if (*(uint *)&pDevice_local[2].super_IObject._vptr_IObject <=
          *(uint *)*(char (*) [33])msg_4.field_2._8_8_) {
        FormatString<char[33],unsigned_int,char[43],unsigned_int,char[48]>
                  ((string *)&pAttachment_2,(Diligent *)"Depth-stencil attachment index (",
                   (char (*) [33])msg_4.field_2._8_8_,
                   (uint *)") must be less than the attachment count (",
                   (char (*) [43])(pDevice_local + 2),
                   (uint *)") as this is ensured by ValidateRenderPassDesc.",
                   (char (*) [48])in_stack_fffffffffffffb18);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"ValidateFramebufferDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                   ,0x12a);
        std::__cxx11::string::~string((string *)&pAttachment_2);
      }
      local_238 = pDevice_local[3].super_IObject._vptr_IObject + *(uint *)msg_4.field_2._8_8_;
      if (*local_238 == (_func_int *)0x0) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_420 = (TextureViewDesc *)0xe30c4c;
        }
        else {
          local_420 = (TextureViewDesc *)(pDevice_local->super_IObject)._vptr_IObject;
        }
        ViewDesc_3 = local_420;
        in_stack_fffffffffffffb18 = "\' is invalid: ";
        LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[25]>
                  (false,"ValidateFramebufferDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                   ,0x132,(char (*) [29])"Description of framebuffer \'",(char **)&ViewDesc_3,
                   (char (*) [15])"\' is invalid: ",(char (*) [21])0xf54d26,
                   (uint *)msg_4.field_2._8_8_,
                   (char (*) [49])" is used as depth-stencil attachment by subpass ",
                   (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                   (char (*) [25])"\', and must not be null.");
      }
      local_248 = (**(code **)(*(long *)*local_238 + 0x20))();
      if ((*(char *)(local_248 + 8) != '\x03') && (*(char *)(local_248 + 8) != '\x04')) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_428 = (TextureDesc *)0xe30c4c;
        }
        else {
          local_428 = (TextureDesc *)(pDevice_local->super_IObject)._vptr_IObject;
        }
        TexDesc_4 = local_428;
        in_stack_fffffffffffffb18 = "\' is invalid: ";
        LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[84]>
                  (false,"ValidateFramebufferDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                   ,0x13b,(char (*) [29])"Description of framebuffer \'",(char **)&TexDesc_4,
                   (char (*) [15])"\' is invalid: ",(char (*) [21])0xf54d26,
                   (uint *)msg_4.field_2._8_8_,
                   (char (*) [49])" is used as depth-stencil attachment by subpass ",
                   (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                   (char (*) [84])
                   "\', but is not a TEXTURE_VIEW_DEPTH_STENCIL or TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL."
                  );
      }
      plVar8 = (long *)(**(code **)(*(long *)*local_238 + 0x50))();
      local_258 = (char **)(**(code **)(*plVar8 + 0x20))();
      BVar4 = operator&(*(BIND_FLAGS *)((long)local_258 + 0x24),BIND_DEPTH_STENCIL);
      if (BVar4 == BIND_NONE) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_430 = (_func_int **)0xe30c4c;
        }
        else {
          local_430 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        _i_3 = local_430;
        in_stack_fffffffffffffb18 = "\' is invalid: ";
        LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[58]>
                  (false,"ValidateFramebufferDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                   ,0x149,(char (*) [29])"Description of framebuffer \'",(char **)&i_3,
                   (char (*) [15])"\' is invalid: ",(char (*) [17])"the attachment \'",local_258,
                   (char (*) [12])"\' at index ",(uint *)msg_4.field_2._8_8_,
                   (char (*) [49])" is used as depth-stencil attachment by subpass ",
                   (uint *)((long)&Subpass + 4),(char (*) [18])0xf545e7,local_68,
                   (char (*) [58])"\', but was not created with BIND_DEPTH_STENCIL bind flag.");
      }
    }
  }
  Subpass_1._7_1_ = 0;
  for (Subpass_1._0_4_ = 0; (uint)Subpass_1 < *(uint *)(local_68 + 3);
      Subpass_1._0_4_ = (uint)Subpass_1 + 1) {
    if ((*(long *)(local_68[4] + (ulong)(uint)Subpass_1 * 0x48 + 0x40) != 0) &&
       (msg_5.field_2._8_8_ = *(undefined8 *)(local_68[4] + (ulong)(uint)Subpass_1 * 0x48 + 0x40),
       *(int *)*(char (*) [32])msg_5.field_2._8_8_ != -1)) {
      if (*(uint *)&pDevice_local[2].super_IObject._vptr_IObject <=
          *(uint *)*(char (*) [32])msg_5.field_2._8_8_) {
        FormatString<char[32],unsigned_int,char[43],unsigned_int,char[48]>
                  ((string *)&pAttachment_3,(Diligent *)"Shading rate attachment index (",
                   (char (*) [32])msg_5.field_2._8_8_,
                   (uint *)") must be less than the attachment count (",
                   (char (*) [43])(pDevice_local + 2),
                   (uint *)") as this is ensured by ValidateRenderPassDesc.",
                   (char (*) [48])in_stack_fffffffffffffb18);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"ValidateFramebufferDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                   ,0x15a);
        std::__cxx11::string::~string((string *)&pAttachment_3);
      }
      Args_1_00 = (char (*) [37])((ulong)*(uint *)msg_5.field_2._8_8_ * 8);
      local_2a0 = *Args_1_00 + (long)pDevice_local[3].super_IObject._vptr_IObject;
      if (*(long *)local_2a0 == 0) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_458 = (TextureViewDesc *)0xe30c4c;
        }
        else {
          local_458 = (TextureViewDesc *)(pDevice_local->super_IObject)._vptr_IObject;
        }
        ViewDesc_4 = local_458;
        Args_1_00 = (char (*) [37])0x162;
        in_stack_fffffffffffffb18 = "\' is invalid: ";
        LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[48],unsigned_int,char[18],char_const*,char[25]>
                  (false,"ValidateFramebufferDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                   ,0x162,(char (*) [29])"Description of framebuffer \'",(char **)&ViewDesc_4,
                   (char (*) [15])"\' is invalid: ",(char (*) [21])0xf54d26,
                   (uint *)msg_5.field_2._8_8_,
                   (char (*) [48])" is used as shading rate attachment by subpass ",
                   (uint *)&Subpass_1,(char (*) [18])0xf545e7,local_68,
                   (char (*) [25])"\', and must not be null.");
      }
      lVar6 = (**(code **)(**(long **)local_2a0 + 0x20))();
      if (*(char *)(lVar6 + 8) != '\x06') {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_460 = (_func_int **)0xe30c4c;
        }
        else {
          local_460 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        msg_6.field_2._8_8_ = local_460;
        Args_1_00 = (char (*) [37])0x16b;
        in_stack_fffffffffffffb18 = "\' is invalid: ";
        LogError<true,char[29],char_const*,char[15],char[21],unsigned_int,char[48],unsigned_int,char[18],char_const*,char[43]>
                  (false,"ValidateFramebufferDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                   ,0x16b,(char (*) [29])"Description of framebuffer \'",
                   (char **)((long)&msg_6.field_2 + 8),(char (*) [15])"\' is invalid: ",
                   (char (*) [21])0xf54d26,(uint *)msg_5.field_2._8_8_,
                   (char (*) [48])" is used as shading rate attachment by subpass ",
                   (uint *)&Subpass_1,(char (*) [18])0xf545e7,local_68,
                   (char (*) [43])"\', but is not a TEXTURE_VIEW_SHADING_RATE.");
      }
      if ((AttDesc._7_1_ & 1) == 0) {
        plVar8 = (long *)(**(code **)(**(long **)local_2a0 + 0x50))();
        local_2e0 = (char **)(**(code **)(*plVar8 + 0x20))();
        BVar4 = operator&(*(BIND_FLAGS *)((long)local_2e0 + 0x24),BIND_FLAG_LAST);
        if (BVar4 == BIND_NONE) {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_470 = (ShadingRateProperties *)0xe30c4c;
          }
          else {
            local_470 = (ShadingRateProperties *)(pDevice_local->super_IObject)._vptr_IObject;
          }
          SRProps = local_470;
          in_stack_fffffffffffffb18 = "\' is invalid: ";
          LogError<true,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[48],unsigned_int,char[18],char_const*,char[57]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0x17a,(char (*) [29])"Description of framebuffer \'",(char **)&SRProps,
                     (char (*) [15])"\' is invalid: ",(char (*) [17])"the attachment \'",local_2e0,
                     (char (*) [12])"\' at index ",(uint *)msg_5.field_2._8_8_,
                     (char (*) [48])" is used as shading rate attachment by subpass ",
                     (uint *)&Subpass_1,(char (*) [18])0xf545e7,local_68,
                     (char (*) [57])"\', but was not created with BIND_SHADING_RATE bind flag.");
        }
      }
      else {
        lVar6 = (**(code **)(**(long **)local_2a0 + 0x50))();
        if (lVar6 != 0) {
          FormatString<char[26],char[37]>
                    ((string *)&TexDesc_5,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"pAttachment->GetTexture() == nullptr",Args_1_00);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0x170);
          std::__cxx11::string::~string((string *)&TexDesc_5);
        }
      }
      Subpass_1._7_1_ = 1;
    }
  }
  iVar3 = (*(local_40->super_IObject)._vptr_IObject[0x19])();
  msg_7.field_2._8_8_ = CONCAT44(extraout_var_00,iVar3) + 0x140;
  if ((((AttDesc._7_1_ & 1) == 0) && ((Subpass_1._7_1_ & 1) != 0)) &&
     (SVar2 = operator&(*(SHADING_RATE_CAP_FLAGS *)(CONCAT44(extraout_var_00,iVar3) + 0x154),
                        SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET),
     SVar2 == SHADING_RATE_CAP_FLAG_NONE)) {
    SVar2 = operator&(*(SHADING_RATE_CAP_FLAGS *)(msg_7.field_2._8_8_ + 0x14),
                      SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET);
    if (SVar2 == SHADING_RATE_CAP_FLAG_NONE) {
      FormatString<char[121]>
                ((string *)local_310,
                 (char (*) [121])
                 "One of NON_SUBSAMPLED_RENDER_TARGET or SUBSAMPLED_RENDER_TARGET caps must be presented if texture-based VRS is supported"
                );
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"ValidateFramebufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                 ,0x187);
      std::__cxx11::string::~string((string *)local_310);
    }
    for (TexDesc_6._4_4_ = 0; TexDesc_6._4_4_ < *(uint *)(local_68 + 1);
        TexDesc_6._4_4_ = TexDesc_6._4_4_ + 1) {
      if ((pDevice_local[3].super_IObject._vptr_IObject[TexDesc_6._4_4_] != (_func_int *)0x0) &&
         (lVar6 = (**(code **)(*(long *)pDevice_local[3].super_IObject._vptr_IObject
                                        [TexDesc_6._4_4_] + 0x20))(), *(char *)(lVar6 + 8) != '\x06'
         )) {
        plVar8 = (long *)(**(code **)(*(long *)pDevice_local[3].super_IObject._vptr_IObject
                                               [TexDesc_6._4_4_] + 0x50))();
        local_320 = (**(code **)(*plVar8 + 0x20))();
        MVar1 = operator&(*(MISC_TEXTURE_FLAGS *)(local_320 + 0x2a),MISC_TEXTURE_FLAG_SUBSAMPLED);
        if (MVar1 == MISC_TEXTURE_FLAG_NONE) {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_498 = (_func_int **)0xe30c4c;
          }
          else {
            local_498 = (pDevice_local->super_IObject)._vptr_IObject;
          }
          local_328 = local_498;
          LogError<true,char[29],char_const*,char[15],char[12],unsigned_int,char[58],char[88],char[105]>
                    (false,"ValidateFramebufferDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/FramebufferBase.cpp"
                     ,0x196,(char (*) [29])"Description of framebuffer \'",(char **)&local_328,
                     (char (*) [15])"\' is invalid: ",(char (*) [12])0xf5033a,
                     (uint *)((long)&TexDesc_6 + 4),
                     (char (*) [58])" must be created with MISC_TEXTURE_FLAG_SUBSAMPLED flag. ",
                     (char (*) [88])
                     "If capability SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET is not supported, all "
                     ,(char (*) [105])
                      "attachments except shading rate texture must have been created with a MISC_TEXTURE_FLAG_SUBSAMPLED flag."
                    );
        }
      }
    }
  }
  return;
}

Assistant:

void ValidateFramebufferDesc(const FramebufferDesc& Desc, IRenderDevice* pDevice) noexcept(false)
{
#define LOG_FRAMEBUFFER_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of framebuffer '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    if (Desc.pRenderPass == nullptr)
    {
        LOG_FRAMEBUFFER_ERROR_AND_THROW("render pass must not be null.");
    }

    if (Desc.AttachmentCount != 0 && Desc.ppAttachments == nullptr)
    {
        // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, and attachmentCount is not 0,
        // pAttachments must be a valid pointer to an array of attachmentCount valid VkImageView handles.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-flags-02778
        LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment count is not zero, but ppAttachments is null.");
    }

    for (Uint32 i = 0; i < Desc.AttachmentCount; ++i)
    {
        if (Desc.ppAttachments[i] == nullptr)
        {
            // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, and attachmentCount is not 0,
            // pAttachments must be a valid pointer to an array of attachmentCount valid VkImageView handles.
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-flags-02778
            LOG_FRAMEBUFFER_ERROR_AND_THROW("framebuffer attachment ", i, " is null.");
        }
    }

    const auto& RPDesc = Desc.pRenderPass->GetDesc();
    if (Desc.AttachmentCount != RPDesc.AttachmentCount)
    {
        // AttachmentCount must be equal to the attachment count specified in renderPass.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-attachmentCount-00876
        LOG_FRAMEBUFFER_ERROR_AND_THROW("the number of framebuffer attachments (", Desc.AttachmentCount,
                                        ") must be equal to the number of attachments (", RPDesc.AttachmentCount,
                                        ") in the render pass '", RPDesc.Name, "'.");
    }

    const bool IsMetal = pDevice->GetDeviceInfo().IsMetalDevice();

    for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
    {
        if (Desc.ppAttachments[i] == nullptr)
            continue;

        const auto& AttDesc  = RPDesc.pAttachments[i];
        const auto& ViewDesc = Desc.ppAttachments[i]->GetDesc();

        // Metal backend has different implementation for ITextureView with shading rate view.
        if (IsMetal && ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE)
        {
            VERIFY_EXPR(Desc.ppAttachments[i]->GetTexture() == nullptr);
            continue;
        }

        const auto& TexDesc = Desc.ppAttachments[i]->GetTexture()->GetDesc();

        // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments
        // must have been created with a VkFormat value that matches the VkFormat specified by the corresponding
        // VkAttachmentDescription in renderPass
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00880
        if (ViewDesc.Format != AttDesc.Format)
        {
            LOG_FRAMEBUFFER_ERROR_AND_THROW("the format (", GetTextureFormatAttribs(ViewDesc.Format).Name, ") of attachment ", i,
                                            " does not match the format (", GetTextureFormatAttribs(AttDesc.Format).Name,
                                            ") defined by the render pass for the same attachment.");
        }

        // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments must have
        // been created with a samples value that matches the samples value specified by the corresponding
        // VkAttachmentDescription in renderPass
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00881
        if (TexDesc.SampleCount != AttDesc.SampleCount)
        {
            LOG_FRAMEBUFFER_ERROR_AND_THROW("the sample count (", Uint32{TexDesc.SampleCount}, ") of attachment ", i,
                                            " does not match the sample count (", Uint32{AttDesc.SampleCount},
                                            ") defined by the render pass for the same attachment.");
        }

        if ((TexDesc.MiscFlags & MISC_TEXTURE_FLAG_MEMORYLESS) != 0)
        {
            const bool HasStencilComponent = GetTextureFormatAttribs(AttDesc.Format).ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;

            if (AttDesc.LoadOp == ATTACHMENT_LOAD_OP_LOAD ||
                (HasStencilComponent && AttDesc.StencilLoadOp == ATTACHMENT_LOAD_OP_LOAD))
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("memoryless attachment ", i, " is not compatible with ATTACHMENT_LOAD_OP_LOAD");
            }
            if (AttDesc.StoreOp == ATTACHMENT_STORE_OP_STORE ||
                (HasStencilComponent && AttDesc.StencilStoreOp == ATTACHMENT_STORE_OP_STORE))
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("memoryless attachment ", i, " is not compatible with ATTACHMENT_STORE_OP_STORE");
            }

#if PLATFORM_MACOS || PLATFORM_IOS || PLATFORM_TVOS
            {
                Uint32 NumSubpasses = 0;
                for (Uint32 s = 0; s < RPDesc.SubpassCount; ++s)
                {
                    const auto& Subpass = RPDesc.pSubpasses[s];

                    bool UsedInSubpass = false;
                    for (Uint32 rt_attachment = 0; rt_attachment < Subpass.RenderTargetAttachmentCount; ++rt_attachment)
                    {
                        const auto& AttchRef = Subpass.pRenderTargetAttachments[rt_attachment];
                        if (AttchRef.AttachmentIndex == i)
                            UsedInSubpass = true;
                    }
                    for (Uint32 input_attachment = 0; input_attachment < Subpass.InputAttachmentCount; ++input_attachment)
                    {
                        const auto& AttchRef = Subpass.pInputAttachments[input_attachment];
                        if (AttchRef.AttachmentIndex == i)
                            UsedInSubpass = true;
                    }
                    if (Subpass.pDepthStencilAttachment != nullptr && Subpass.pDepthStencilAttachment->AttachmentIndex == i)
                        UsedInSubpass = true;

                    if (UsedInSubpass)
                        ++NumSubpasses;
                }
                if (NumSubpasses > 1)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("memoryless attachment ", i,
                                                    " is used in more than one subpass, which is not supported on MacOS/iOS "
                                                    "as the contents of the attachment can't be preserved between subpasses without "
                                                    "storing it in global memory.");
                }
            }
#endif
        }
    }

    for (Uint32 i = 0; i < RPDesc.SubpassCount; ++i)
    {
        const auto& Subpass = RPDesc.pSubpasses[i];
        for (Uint32 input_attachment = 0; input_attachment < Subpass.InputAttachmentCount; ++input_attachment)
        {
            const auto& AttchRef = Subpass.pInputAttachments[input_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            VERIFY(AttchRef.AttachmentIndex < Desc.AttachmentCount,
                   "Input attachment index (", AttchRef.AttachmentIndex, ") must be less than the attachment count (",
                   Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

            if (Desc.ppAttachments[AttchRef.AttachmentIndex] == nullptr)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                " is used as input attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', and must not be null.");
            }

            const auto& TexDesc = Desc.ppAttachments[AttchRef.AttachmentIndex]->GetTexture()->GetDesc();

            // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments that
            // is used as an input attachment by renderPass must have been created with a usage value including
            // VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00879
            if ((TexDesc.BindFlags & BIND_INPUT_ATTACHMENT) == 0)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.AttachmentIndex,
                                                " is used as input attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', but was not created with BIND_INPUT_ATTACHMENT bind flag.");
            }
        }

        for (Uint32 rt_attachment = 0; rt_attachment < Subpass.RenderTargetAttachmentCount; ++rt_attachment)
        {
            const auto& AttchRef = Subpass.pRenderTargetAttachments[rt_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            VERIFY(AttchRef.AttachmentIndex < Desc.AttachmentCount,
                   "Render target attachment index (", AttchRef.AttachmentIndex, ") must be less than the attachment count (",
                   Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

            const auto& pAttachment = Desc.ppAttachments[AttchRef.AttachmentIndex];
            if (pAttachment == nullptr)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                " is used as render target attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', and must not be null.");
            }

            const auto& ViewDesc = pAttachment->GetDesc();
            if (ViewDesc.ViewType != TEXTURE_VIEW_RENDER_TARGET)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                " is used as render target attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', but is not a TEXTURE_VIEW_RENDER_TARGET.");
            }

            const auto& TexDesc = pAttachment->GetTexture()->GetDesc();

            // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments that is used
            // as a color attachment or resolve attachment by renderPass must have been created with a usage value including
            // VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00877
            if ((TexDesc.BindFlags & BIND_RENDER_TARGET) == 0)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.AttachmentIndex,
                                                " is used as render target attachment by subpass ",
                                                i, " of render pass '", RPDesc.Name,
                                                "', but was not created with BIND_RENDER_TARGET bind flag.");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 rslv_attachment = 0; rslv_attachment < Subpass.RenderTargetAttachmentCount; ++rslv_attachment)
            {
                const auto& AttchRef = Subpass.pResolveAttachments[rslv_attachment];
                if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                    continue;

                VERIFY(AttchRef.AttachmentIndex < Desc.AttachmentCount,
                       "Resolve attachment index (", AttchRef.AttachmentIndex, ") must be less than the attachment count (",
                       Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

                const auto& pAttachment = Desc.ppAttachments[AttchRef.AttachmentIndex];
                if (pAttachment == nullptr)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                    " is used as resolve attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', and must not be null.");
                }

                const auto& ViewDesc = pAttachment->GetDesc();
                if (ViewDesc.ViewType != TEXTURE_VIEW_RENDER_TARGET)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                    " is used as resolve attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but is not a TEXTURE_VIEW_RENDER_TARGET.");
                }

                const auto& TexDesc = pAttachment->GetTexture()->GetDesc();

                // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments that is used
                // as a color attachment or resolve attachment by renderPass must have been created with a usage value including
                // VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-00877
                if ((TexDesc.BindFlags & BIND_RENDER_TARGET) == 0)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.AttachmentIndex,
                                                    " is used as resolve attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but was not created with BIND_RENDER_TARGET bind flag.");
                }
            }
        }

        if (Subpass.pDepthStencilAttachment != nullptr)
        {
            const auto& AttchRef = *Subpass.pDepthStencilAttachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                VERIFY(AttchRef.AttachmentIndex < Desc.AttachmentCount,
                       "Depth-stencil attachment index (", AttchRef.AttachmentIndex, ") must be less than the attachment count (",
                       Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

                const auto& pAttachment = Desc.ppAttachments[AttchRef.AttachmentIndex];
                if (pAttachment == nullptr)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                    " is used as depth-stencil attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', and must not be null.");
                }

                const auto& ViewDesc = pAttachment->GetDesc();
                if (ViewDesc.ViewType != TEXTURE_VIEW_DEPTH_STENCIL && ViewDesc.ViewType != TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.AttachmentIndex,
                                                    " is used as depth-stencil attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but is not a TEXTURE_VIEW_DEPTH_STENCIL or TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL.");
                }

                const auto& TexDesc = pAttachment->GetTexture()->GetDesc();

                // If flags does not include VK_FRAMEBUFFER_CREATE_IMAGELESS_BIT, each element of pAttachments that is
                // used as a depth/stencil attachment by renderPass must have been created with a usage value including
                // VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkFramebufferCreateInfo-pAttachments-02633
                if ((TexDesc.BindFlags & BIND_DEPTH_STENCIL) == 0)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.AttachmentIndex,
                                                    " is used as depth-stencil attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but was not created with BIND_DEPTH_STENCIL bind flag.");
                }
            }
        }
    }

    bool IsVRSEnabled = false;
    for (Uint32 i = 0; i < RPDesc.SubpassCount; ++i)
    {
        const auto& Subpass = RPDesc.pSubpasses[i];
        if (Subpass.pShadingRateAttachment != nullptr)
        {
            const auto& AttchRef = *Subpass.pShadingRateAttachment;
            if (AttchRef.Attachment.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                VERIFY(AttchRef.Attachment.AttachmentIndex < Desc.AttachmentCount,
                       "Shading rate attachment index (", AttchRef.Attachment.AttachmentIndex, ") must be less than the attachment count (",
                       Desc.AttachmentCount, ") as this is ensured by ValidateRenderPassDesc.");

                const auto& pAttachment = Desc.ppAttachments[AttchRef.Attachment.AttachmentIndex];
                if (pAttachment == nullptr)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.Attachment.AttachmentIndex,
                                                    " is used as shading rate attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', and must not be null.");
                }

                const auto& ViewDesc = pAttachment->GetDesc();
                if (ViewDesc.ViewType != TEXTURE_VIEW_SHADING_RATE)
                {
                    LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment at index ", AttchRef.Attachment.AttachmentIndex,
                                                    " is used as shading rate attachment by subpass ",
                                                    i, " of render pass '", RPDesc.Name,
                                                    "', but is not a TEXTURE_VIEW_SHADING_RATE.");
                }

                if (IsMetal)
                {
                    VERIFY_EXPR(pAttachment->GetTexture() == nullptr);
                }
                else
                {
                    const auto& TexDesc = pAttachment->GetTexture()->GetDesc();
                    if ((TexDesc.BindFlags & BIND_SHADING_RATE) == 0)
                    {
                        LOG_FRAMEBUFFER_ERROR_AND_THROW("the attachment '", TexDesc.Name, "' at index ", AttchRef.Attachment.AttachmentIndex,
                                                        " is used as shading rate attachment by subpass ",
                                                        i, " of render pass '", RPDesc.Name,
                                                        "', but was not created with BIND_SHADING_RATE bind flag.");
                    }
                }

                IsVRSEnabled = true;
            }
        }
    }

    const auto& SRProps = pDevice->GetAdapterInfo().ShadingRate;
    if (!IsMetal && IsVRSEnabled && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET) == 0)
    {
        VERIFY((SRProps.CapFlags & SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET) != 0,
               "One of NON_SUBSAMPLED_RENDER_TARGET or SUBSAMPLED_RENDER_TARGET caps must be presented if texture-based VRS is supported");

        for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
        {
            if (Desc.ppAttachments[i] == nullptr)
                continue;

            if (Desc.ppAttachments[i]->GetDesc().ViewType == TEXTURE_VIEW_SHADING_RATE)
                continue;

            const auto& TexDesc = Desc.ppAttachments[i]->GetTexture()->GetDesc();
            if ((TexDesc.MiscFlags & MISC_TEXTURE_FLAG_SUBSAMPLED) == 0)
            {
                LOG_FRAMEBUFFER_ERROR_AND_THROW("attachment ", i, " must be created with MISC_TEXTURE_FLAG_SUBSAMPLED flag. ",
                                                "If capability SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET is not supported, all ",
                                                "attachments except shading rate texture must have been created with a MISC_TEXTURE_FLAG_SUBSAMPLED flag.");
            }
        }
    }
}